

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder.cpp
# Opt level: O0

uint bidfx_public_api::tools::HexEncoder::DecodeNibble(uchar c)

{
  ostream *poVar1;
  invalid_argument *this;
  string local_1c8 [48];
  stringstream local_198 [8];
  stringstream error_message;
  ostream local_188 [379];
  uchar local_d;
  uint local_c;
  uchar c_local;
  
  if ((c < 0x30) || (0x39 < c)) {
    if ((c < 0x61) || (0x66 < c)) {
      if ((c < 0x41) || (0x46 < c)) {
        local_d = c;
        std::__cxx11::stringstream::stringstream(local_198);
        poVar1 = std::operator<<(local_188,"cannot decode non-hex character: ");
        poVar1 = std::operator<<(poVar1,local_d);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::invalid_argument::invalid_argument(this,local_1c8);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      local_c = c - 0x37;
    }
    else {
      local_c = c - 0x57;
    }
  }
  else {
    local_c = c - 0x30;
  }
  return local_c;
}

Assistant:

unsigned int HexEncoder::DecodeNibble(unsigned char c)
{
    if (c >= '0' && c <= '9') return c - '0';
    if (c >= 'a' && c <= 'f') return c - 'a' + 10u;
    if (c >= 'A' && c <= 'F') return c - 'A' + 10u;

    std::stringstream error_message;
    error_message << "cannot decode non-hex character: " << c << std::endl;
    throw std::invalid_argument(error_message.str());
}